

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

int NeedCompressedAlpha(WebPIDecoder *idec)

{
  byte local_19;
  VP8Decoder *dec;
  WebPIDecoder *idec_local;
  uint local_4;
  
  if (idec->state_ == STATE_WEBP_HEADER) {
    local_4 = 0;
  }
  else if (idec->is_lossless_ == 0) {
    local_19 = 0;
    if (*(long *)((long)idec->dec_ + 0xb98) != 0) {
      local_19 = *(int *)((long)idec->dec_ + 0xba8) != 0 ^ 0xff;
    }
    local_4 = (uint)(local_19 & 1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int NeedCompressedAlpha(const WebPIDecoder* const idec) {
  if (idec->state_ == STATE_WEBP_HEADER) {
    // We haven't parsed the headers yet, so we don't know whether the image is
    // lossy or lossless. This also means that we haven't parsed the ALPH chunk.
    return 0;
  }
  if (idec->is_lossless_) {
    return 0;  // ALPH chunk is not present for lossless images.
  } else {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
    assert(dec != NULL);  // Must be true as idec->state_ != STATE_WEBP_HEADER.
    return (dec->alpha_data_ != NULL) && !dec->is_alpha_decoded_;
  }
}